

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O3

lws * lws_adopt_descriptor_vhost
                (lws_vhost *vh,lws_adoption_type type,lws_sock_file_fd_type fd,char *vh_prot_name,
                lws *parent)

{
  lws *plVar1;
  lws_adopt_desc_t local_28;
  
  local_28.opaque = (void *)0x0;
  local_28.vh = vh;
  local_28.type = type;
  local_28.fd = fd;
  local_28.vh_prot_name = vh_prot_name;
  local_28.parent = parent;
  plVar1 = lws_adopt_descriptor_vhost_via_info(&local_28);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_descriptor_vhost(struct lws_vhost *vh, lws_adoption_type type,
			   lws_sock_file_fd_type fd, const char *vh_prot_name,
			   struct lws *parent)
{
	lws_adopt_desc_t info;

	memset(&info, 0, sizeof(info));

	info.vh = vh;
	info.type = type;
	info.fd = fd;
	info.vh_prot_name = vh_prot_name;
	info.parent = parent;

	return lws_adopt_descriptor_vhost_via_info(&info);
}